

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

int64_t __thiscall adios2::profiling::Timer::GetElapsedTime(Timer *this)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__rhs;
  long in_RDI;
  int64_t time;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  duration<long,_std::ratio<3600L,_1L>_> local_120;
  rep local_118;
  duration<long,_std::ratio<60L,_1L>_> in_stack_fffffffffffffef0;
  int commRank;
  string *in_stack_fffffffffffffef8;
  duration<long,_std::ratio<1L,_1L>_> in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  duration<long,_std::ratio<1L,_1000L>_> in_stack_ffffffffffffff10;
  duration<long,_std::ratio<1L,_1000000L>_> local_e0;
  rep local_d8;
  string local_d0 [32];
  string local_b0 [39];
  undefined1 local_89 [40];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  if ((*(byte *)(in_RDI + 0x90) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Toolkit",&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"profiling::iochrono::Timer",&local_61);
    in_stack_fffffffffffffeb8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_89 + 1),"GetElapsedTime",(allocator *)in_stack_fffffffffffffeb8);
    std::operator+((char *)in_stack_fffffffffffffef8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffef0.__r);
    commRank = (int)((ulong)in_stack_fffffffffffffef0.__r >> 0x20);
    std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    helper::Throw<std::invalid_argument>
              ((string *)in_stack_ffffffffffffff10.__r,in_stack_ffffffffffffff08,
               (string *)in_stack_ffffffffffffff00.__r,in_stack_fffffffffffffef8,commRank);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  local_d8 = -1;
  __rhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *)(ulong)*(uint *)(in_RDI + 0x30);
  switch(__rhs) {
  case (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)0x0:
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffeb8,__rhs);
    local_e0.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_fffffffffffffea8);
    local_d8 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_e0);
    break;
  case (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)0x1:
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffeb8,__rhs);
    std::chrono::
    duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
              (in_stack_fffffffffffffea8);
    local_d8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                         ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xffffffffffffff10);
    break;
  case (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)0x2:
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffeb8,__rhs);
    std::chrono::
    duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
              (in_stack_fffffffffffffea8);
    local_d8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                         ((duration<long,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffff00);
    break;
  case (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)0x3:
    local_118 = (rep)std::chrono::operator-
                               ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_fffffffffffffeb8,__rhs);
    std::chrono::
    duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000000l>>
              (in_stack_fffffffffffffea8);
    local_d8 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count
                         ((duration<long,_std::ratio<60L,_1L>_> *)&stack0xfffffffffffffef0);
    break;
  case (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)0x4:
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffeb8,__rhs);
    local_120.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<3600l,1l>>,long,std::ratio<1l,1000000000l>>
                        (in_stack_fffffffffffffea8);
    local_d8 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(&local_120);
  }
  return local_d8;
}

Assistant:

int64_t Timer::GetElapsedTime()
{
    if (!m_InitialTimeSet)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "profiling::iochrono::Timer",
                                             "GetElapsedTime",
                                             "Resume() in process " + m_Process + " not called");
    }

    int64_t time = -1;

    switch (m_TimeUnit)
    {

    case TimeUnit::Microseconds:
        time = std::chrono::duration_cast<std::chrono::microseconds>(m_ElapsedTime - m_InitialTime)
                   .count();
        break;

    case TimeUnit::Milliseconds:
        time = std::chrono::duration_cast<std::chrono::milliseconds>(m_ElapsedTime - m_InitialTime)
                   .count();
        break;

    case TimeUnit::Seconds:
        time =
            std::chrono::duration_cast<std::chrono::seconds>(m_ElapsedTime - m_InitialTime).count();
        break;

    case TimeUnit::Minutes:
        time =
            std::chrono::duration_cast<std::chrono::minutes>(m_ElapsedTime - m_InitialTime).count();
        break;

    case TimeUnit::Hours:
        time =
            std::chrono::duration_cast<std::chrono::hours>(m_ElapsedTime - m_InitialTime).count();
        break;
    }

    return time;
}